

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::SerializeWithCachedSizes
          (BiDirectionalLSTMLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  Type *pTVar2;
  Type *value;
  int iVar3;
  
  if (this->inputvectorsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->inputvectorsize_,output);
  }
  if (this->outputvectorsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->outputvectorsize_,output);
  }
  iVar1 = (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar3 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,iVar3);
      google::protobuf::internal::WireFormatLite::WriteMessage(10,&pTVar2->super_MessageLite,output)
      ;
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
  }
  iVar1 = (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar3 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,iVar3);
      google::protobuf::internal::WireFormatLite::WriteMessage
                (0xb,&pTVar2->super_MessageLite,output);
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
  }
  if (this != (BiDirectionalLSTMLayerParams *)&_BiDirectionalLSTMLayerParams_default_instance_ &&
      this->params_ != (LSTMParams *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xf,&this->params_->super_MessageLite,output);
  }
  iVar1 = (this->weightparams_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar3 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                        (&(this->weightparams_).super_RepeatedPtrFieldBase,iVar3);
      google::protobuf::internal::WireFormatLite::WriteMessage
                (0x14,&value->super_MessageLite,output);
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
  }
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputvectorsize(), output);
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputvectorsize(), output);
  }

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  for (unsigned int i = 0, n = this->activationsforwardlstm_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->activationsforwardlstm(i), output);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  for (unsigned int i = 0, n = this->activationsbackwardlstm_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, this->activationsbackwardlstm(i), output);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      15, *this->params_, output);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  for (unsigned int i = 0, n = this->weightparams_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, this->weightparams(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BiDirectionalLSTMLayerParams)
}